

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  char *buf;
  float text_baseline_y;
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar8;
  ImVec2 value_size;
  ImRect value_bb;
  ImRect total_bb;
  ImVec2 local_80;
  undefined1 local_78 [16];
  float local_60;
  float fStack_5c;
  ImVec2 IStack_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_78._0_4_ = CalcItemWidth();
    local_78._4_4_ = extraout_XMM0_Db;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._12_4_ = extraout_XMM0_Dd;
    buf = pIVar4->TempBuffer;
    iVar6 = ImFormatStringV(buf,0xc01,fmt,args);
    local_80 = CalcTextSize(buf,pIVar4->TempBuffer + iVar6,false,-1.0);
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    IVar2 = (pIVar1->DC).CursorPos;
    text_baseline_y = (pIVar4->Style).FramePadding.y;
    local_60 = IVar2.x;
    IStack_58.x = (float)local_78._0_4_ + local_60;
    fStack_5c = IVar2.y;
    IStack_58.y = text_baseline_y + text_baseline_y + local_80.y + fStack_5c;
    fVar8 = 0.0;
    if (0.0 < IVar3.x) {
      fVar8 = (pIVar4->Style).ItemInnerSpacing.x + IVar3.x;
    }
    fVar8 = (float)local_78._0_4_ + fVar8;
    local_78._8_4_ = extraout_XMM0_Dc_00;
    local_78._0_4_ = IVar3.x;
    local_78._4_4_ = IVar3.y;
    local_78._12_4_ = extraout_XMM0_Dd_00;
    uVar7 = -(uint)(IVar3.y <= local_80.y);
    local_40.Max.y =
         text_baseline_y + text_baseline_y +
         (float)(~uVar7 & (uint)IVar3.y | (uint)local_80.y & uVar7) + fStack_5c;
    local_40.Max.x = fVar8 + local_60;
    local_40.Min.x = local_60;
    local_40.Min.y = fStack_5c;
    ItemSize(&local_40,text_baseline_y);
    bVar5 = ItemAdd(&local_40,0,(ImRect *)0x0,0);
    if (bVar5) {
      IVar2 = (pIVar4->Style).FramePadding;
      local_48.x = IVar2.x + local_60;
      local_48.y = IVar2.y + fStack_5c;
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_48,&IStack_58,buf,pIVar4->TempBuffer + iVar6,&local_80,&local_50,
                        (ImRect *)0x0);
      if (0.0 < (float)local_78._0_4_) {
        IVar2.y = (pIVar4->Style).FramePadding.y + fStack_5c;
        IVar2.x = (pIVar4->Style).ItemInnerSpacing.x + IStack_58.x;
        RenderText(IVar2,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}